

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogFile.cpp
# Opt level: O0

void __thiscall
higan::LogFile::LogFile(LogFile *this,string *log_dir,string *log_prefix,bool thread_safe)

{
  time_t tVar1;
  bool thread_safe_local;
  string *log_prefix_local;
  string *log_dir_local;
  LogFile *this_local;
  
  if (thread_safe) {
    std::make_unique<higan::Mutex>();
  }
  else {
    std::unique_ptr<higan::Mutex,std::default_delete<higan::Mutex>>::
    unique_ptr<std::default_delete<higan::Mutex>,void>
              ((unique_ptr<higan::Mutex,std::default_delete<higan::Mutex>> *)this,(nullptr_t)0x0);
  }
  std::__cxx11::string::string((string *)&this->log_dir_,(string *)log_dir);
  std::__cxx11::string::string((string *)&this->log_prefix_,(string *)log_prefix);
  tVar1 = time((time_t *)0x0);
  this->last_flush_time_ = tVar1;
  tVar1 = time((time_t *)0x0);
  this->last_roll_time_ = tVar1;
  std::unique_ptr<higan::FileForAppend,std::default_delete<higan::FileForAppend>>::
  unique_ptr<std::default_delete<higan::FileForAppend>,void>
            ((unique_ptr<higan::FileForAppend,std::default_delete<higan::FileForAppend>> *)
             &this->file_ptr_,(nullptr_t)0x0);
  RollFile(this);
  return;
}

Assistant:

LogFile::LogFile(const std::string& log_dir, const std::string& log_prefix, bool thread_safe) :
		mutex_(thread_safe ? std::make_unique<Mutex>() : nullptr),
		log_dir_(log_dir),
		log_prefix_(log_prefix),
		last_flush_time_(time(nullptr)),
		last_roll_time_(time(nullptr)),
		file_ptr_(nullptr)
{
	RollFile();
}